

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O1

void CMCondition_trigger(CManager cm,CMCondition cond,CMControlList cl)

{
  if (cm_control_debug_flag != 0) {
    fprintf((FILE *)cm->CMTrace_file,"CMLowLevel Triggering CMcondition %d\n",
            (ulong)(uint)cond->condition_num);
  }
  if (cond->waiting != 0) {
    if (cm_control_debug_flag != 0) {
      fprintf((FILE *)cm->CMTrace_file,"CMLowLevel Triggering CMcondition %d\n",
              (ulong)(uint)cond->condition_num);
    }
    pthread_cond_signal((pthread_cond_t *)&cond->cond_condition);
  }
  if (cm_control_debug_flag != 0) {
    fprintf((FILE *)cm->CMTrace_file,"CMLowLevel After trigger for CMcondition %d\n",
            (ulong)(uint)cond->condition_num);
    return;
  }
  return;
}

Assistant:

static void
CMCondition_trigger(CManager cm, CMCondition cond, CMControlList cl)
{
    (void)cl;
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel Triggering CMcondition %d\n", cond->condition_num);
    }
    if (cond->waiting) {
	if (cm_control_debug_flag) {
	    fprintf(cm->CMTrace_file, "CMLowLevel Triggering CMcondition %d\n", 
		   cond->condition_num);
	}
	thr_condition_signal(cond->cond_condition);
    }
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel After trigger for CMcondition %d\n", 
	       cond->condition_num);
    }
}